

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

Gia_ObjType_t Gia_ManEncodeFanout(Gia_Man_t *p,Gia_Obj_t *pObj,int i)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  Gia_ObjType_t GVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = *(ulong *)pObj;
  uVar5 = (uint)uVar1;
  uVar6 = (uint)(uVar1 >> 0x20);
  if (((uVar1 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar5) ||
     (GVar3 = oPO, p->vCos->nSize - p->nRegs <= (int)(uVar6 & 0x1fffffff))) {
    iVar4 = (int)(uVar1 & 0x1fffffff);
    GVar3 = oFF;
    if ((-1 < (int)uVar5 || iVar4 == 0x1fffffff) &&
       ((iVar4 == 0x1fffffff || (int)uVar5 < 0 ||
        (GVar3 = oXOR, (uVar6 & 0x1fffffff) <= (uVar5 & 0x1fffffff))))) {
      pGVar2 = p->pObjs;
      if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      if ((p->pMuxes == (uint *)0x0) ||
         (p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555] == 0)) {
        if (((int)uVar5 < 0) || (GVar3 = oAND, iVar4 == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                        ,0x30d,"Gia_ObjType_t Gia_ManEncodeFanout(Gia_Man_t *, Gia_Obj_t *, int)");
        }
      }
      else {
        GVar3 = (i != 2) + oMUXc;
      }
    }
  }
  return GVar3;
}

Assistant:

Gia_ObjType_t Gia_ManEncodeFanout( Gia_Man_t * p, Gia_Obj_t * pObj, int i )
{
//    int iLit;
    if ( Gia_ObjIsPo(p, pObj) )
        return oPO;
    if ( Gia_ObjIsCo(pObj) )
        return oFF;
    if ( Gia_ObjIsXor(pObj) )
        return oXOR;
    if ( Gia_ObjIsMux(p, pObj) )
        return i == 2 ? oMUXc : oMUXd;
    assert( Gia_ObjIsAnd(pObj) );
    return oAND;
//    iLit = i ? Gia_ObjFaninLit1p(p, pObj) : Gia_ObjFaninLit0p(p, pObj);
//    if ( Abc_LitIsCompl(iLit) )
//        return oANDn;
//    else
//        return oANDp;
}